

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::message_hash::test_method(message_hash *this)

{
  long in_FS_OFFSET;
  uint256 message_hash2;
  uint256 message_hash1;
  uint256 signature_hash;
  string prefixed_message;
  string unsigned_tx;
  char *in_stack_fffffffffffffd98;
  lazy_ostream *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  char in_stack_fffffffffffffdbf;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  const_string *file;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  char *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [64];
  undefined1 local_180 [16];
  undefined1 local_170 [69];
  allocator<char> local_12b;
  allocator<char> local_12a;
  allocator<char> local_129;
  lazy_ostream local_128 [2];
  undefined1 local_108 [32];
  lazy_ostream local_e8 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc8,CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
             ,in_stack_fffffffffffffdbf,(allocator<char> *)in_stack_fffffffffffffdb0);
  std::operator+(in_stack_fffffffffffffdb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffda8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc8,CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
             ,in_stack_fffffffffffffdbf,(allocator<char> *)in_stack_fffffffffffffdb0);
  std::operator+(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::operator+(in_stack_fffffffffffffdb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffda8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  std::allocator<char>::~allocator(&local_12b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  std::allocator<char>::~allocator(&local_12a);
  Hash<std::__cxx11::string>(in_stack_fffffffffffffdc8);
  Hash<std::__cxx11::string>(in_stack_fffffffffffffdc8);
  MessageHash((string *)in_stack_fffffffffffffda8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
               (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_stack_fffffffffffffd98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               (const_string *)in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffda0,(char (*) [1])in_stack_fffffffffffffd98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
               (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_stack_fffffffffffffd98);
    in_stack_fffffffffffffda8 = "message_hash2";
    in_stack_fffffffffffffda0 = local_128;
    in_stack_fffffffffffffd98 = "message_hash1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_170,local_180,0x6a4,1,2,local_108);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd98);
    in_stack_fffffffffffffddf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffddf);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
               (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_stack_fffffffffffffd98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),file
               ,(size_t)in_stack_fffffffffffffdc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    in_stack_fffffffffffffdc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffda0,(char (*) [1])in_stack_fffffffffffffd98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
               (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_stack_fffffffffffffd98);
    in_stack_fffffffffffffda8 = "signature_hash";
    in_stack_fffffffffffffda0 = local_e8;
    in_stack_fffffffffffffd98 = "message_hash1";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
              (local_1c0,local_1d0,0x6a5,1,3,local_108);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd98);
    in_stack_fffffffffffffdc7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffdc7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(message_hash)
{
    const std::string unsigned_tx = "...";
    const std::string prefixed_message =
        std::string(1, (char)MESSAGE_MAGIC.length()) +
        MESSAGE_MAGIC +
        std::string(1, (char)unsigned_tx.length()) +
        unsigned_tx;

    const uint256 signature_hash = Hash(unsigned_tx);
    const uint256 message_hash1 = Hash(prefixed_message);
    const uint256 message_hash2 = MessageHash(unsigned_tx);

    BOOST_CHECK_EQUAL(message_hash1, message_hash2);
    BOOST_CHECK_NE(message_hash1, signature_hash);
}